

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O1

void Wlc_NtkCheckIntegrity(void *pData)

{
  byte bVar1;
  long lVar2;
  Vec_Int_t *p;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  int Ent;
  int Fill;
  int extraout_EDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar6;
  uint uVar7;
  int Ent_1;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar3 = (int *)malloc(400);
  p->pArray = piVar3;
  lVar5 = *(long *)((long)pData + 0x10);
  if (3 < *(int *)(lVar5 + 8) + 2) {
    uVar7 = 3;
    do {
      lVar2 = *(long *)((long)pData + 8);
      lVar14 = (long)(int)uVar7;
      if (*(char *)(lVar2 + lVar14) == '\x03') {
        iVar9 = *(int *)(lVar5 + lVar14 * 4) + uVar7;
        uVar15 = 0xffffffff;
        iVar10 = uVar7 + 1;
        for (iVar8 = iVar10; iVar8 < iVar9; iVar8 = iVar8 + iVar13) {
          lVar12 = (long)iVar8;
          bVar1 = *(byte *)(lVar2 + lVar12);
          if (bVar1 == 5) {
            uVar15 = (ulong)*(uint *)(lVar5 + lVar12 * 4);
            break;
          }
          if (bVar1 == 0) goto LAB_00341188;
          iVar13 = 1;
          if (bVar1 < 4) {
            iVar13 = *(int *)(lVar5 + lVar12 * 4);
          }
        }
        iVar8 = (int)uVar15;
        if (iVar8 == -1) {
          iVar8 = -1;
          for (; iVar10 < iVar9; iVar10 = iVar10 + iVar13) {
            lVar12 = (long)iVar10;
            bVar1 = *(byte *)(lVar2 + lVar12);
            if (bVar1 == 6) {
              iVar8 = *(int *)(lVar5 + lVar12 * 4);
              break;
            }
            if (bVar1 == 0) goto LAB_00341188;
            iVar13 = 1;
            if (bVar1 < 4) {
              iVar13 = *(int *)(lVar5 + lVar12 * 4);
            }
          }
          if (iVar8 != 4) {
            pcVar4 = Abc_OperName(iVar8);
            printf("Internal object %d of type %s has no output name.\n",(ulong)uVar7,pcVar4);
          }
        }
        else {
          iVar9 = iVar8 + 1;
          Vec_IntFillExtra(p,iVar9,iVar10);
          if ((iVar8 < 0) || (p->nSize <= iVar8)) goto LAB_00341169;
          iVar10 = Fill;
          if (0 < p->pArray[uVar15]) {
            Vec_IntFillExtra(p,iVar9,Fill);
            if (p->nSize <= iVar8) {
LAB_00341169:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("Output name %d is used more than once (obj %d and obj %d).\n",uVar15,
                   (ulong)(uint)p->pArray[uVar15],(ulong)uVar7);
            iVar10 = extraout_EDX;
          }
          Vec_IntFillExtra(p,iVar9,iVar10);
          if (p->nSize <= iVar8) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          p->pArray[uVar15] = uVar7;
        }
      }
      else if (*(char *)(lVar2 + lVar14) == '\0') goto LAB_00341188;
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar14);
      if (bVar1 == 0) goto LAB_00341188;
      iVar8 = 1;
      if (bVar1 < 4) {
        iVar8 = *(int *)(*(long *)((long)pData + 0x10) + lVar14 * 4);
      }
      uVar7 = uVar7 + iVar8;
      lVar5 = *(long *)((long)pData + 0x10);
    } while ((int)uVar7 < *(int *)(lVar5 + 8) + 2);
  }
  lVar5 = *(long *)((long)pData + 0x10);
  if (3 < *(int *)(lVar5 + 8) + 2) {
    uVar7 = 3;
    do {
      lVar2 = *(long *)((long)pData + 8);
      lVar14 = (long)(int)uVar7;
      if (*(char *)(lVar2 + lVar14) == '\x03') {
        iVar8 = uVar7 + 1;
        iVar9 = *(int *)(lVar5 + lVar14 * 4) + uVar7;
        uVar15 = 0;
        bVar17 = false;
        iVar10 = iVar8;
        if (iVar8 < iVar9) {
          do {
            lVar12 = (long)iVar10;
            bVar1 = *(byte *)(lVar2 + lVar12);
            if (bVar1 == 6) {
              bVar17 = *(int *)(lVar5 + lVar12 * 4) == 0x59;
              goto LAB_0034104f;
            }
            if (bVar1 == 0) goto LAB_00341188;
            iVar13 = 1;
            if (bVar1 < 4) {
              iVar13 = *(int *)(lVar5 + lVar12 * 4);
            }
            iVar10 = iVar10 + iVar13;
          } while (iVar10 < iVar9);
          bVar17 = false;
        }
LAB_0034104f:
        lVar12 = 0;
        if (iVar8 < iVar9) {
          uVar15 = 0;
          do {
            lVar11 = (long)iVar8;
            bVar1 = *(byte *)(lVar2 + lVar11);
            if (bVar1 == 4) {
              uVar15 = (ulong)((int)uVar15 + 1);
              if (lVar12 == 0) {
                lVar12 = lVar5 + lVar11 * 4;
              }
            }
            else {
              if (bVar1 == 0) goto LAB_00341188;
              if (lVar12 != 0) break;
            }
            iVar10 = 1;
            if (bVar1 < 4) {
              iVar10 = *(int *)(lVar5 + lVar11 * 4);
            }
            iVar8 = iVar8 + iVar10;
          } while (iVar8 < iVar9);
        }
        if (0 < (int)uVar15) {
          uVar16 = 0;
          uVar6 = uVar15;
          do {
            iVar8 = *(int *)(lVar12 + uVar16 * 4);
            Vec_IntFillExtra(p,iVar8 + 1,(int)uVar6);
            if (((long)iVar8 < 0) || (p->nSize <= iVar8)) goto LAB_00341169;
            uVar6 = extraout_RDX;
            if ((p->pArray[iVar8] == 0) && (!(bool)(bVar17 & (int)uVar16 - 5U < 3))) {
              printf("Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n"
                     ,(ulong)*(uint *)(lVar12 + uVar16 * 4),uVar16 & 0xffffffff,(ulong)uVar7);
              uVar6 = extraout_RDX_00;
            }
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
      }
      else if (*(char *)(lVar2 + lVar14) == '\0') {
LAB_00341188:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      bVar1 = *(byte *)(*(long *)((long)pData + 8) + lVar14);
      if (bVar1 == 0) goto LAB_00341188;
      iVar8 = 1;
      if (bVar1 < 4) {
        iVar8 = *(int *)(*(long *)((long)pData + 0x10) + lVar14 * 4);
      }
      uVar7 = uVar7 + iVar8;
      lVar5 = *(long *)((long)pData + 0x10);
    } while ((int)uVar7 < *(int *)(lVar5 + 8) + 2);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Wlc_NtkCheckIntegrity( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Vec_Int_t * vMap = Vec_IntAlloc( 100 );
    int Mod = 2, Obj;
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        if ( NameId == -1 )
        {
            int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
            if ( Type != ABC_OPER_CO )
                printf( "Internal object %d of type %s has no output name.\n", Obj, Abc_OperName(Type) );
            continue;
        }
        if ( Vec_IntGetEntry(vMap, NameId) > 0 )
            printf( "Output name %d is used more than once (obj %d and obj %d).\n", NameId, Vec_IntGetEntry(vMap, NameId), Obj );
        Vec_IntSetEntry( vMap, NameId, Obj );
    }
    Ndr_ModForEachObj( p, Mod, Obj )
    {
        int Type = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int i, * pArray, nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        for ( i = 0; i < nArray; i++ )
            if ( Vec_IntGetEntry(vMap, pArray[i]) == 0 && !(Type == ABC_OPER_DFFRSE && (i >= 5 && i <= 7)) )
                printf( "Input name %d appearing as fanin %d of obj %d is not used as output name in any object.\n", pArray[i], i, Obj );
    }
    Vec_IntFree( vMap );
}